

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<UnsatisfiedJump,_false,_false>::grow_and_add
          (FastVector<UnsatisfiedJump,_false,_false> *this,uint newSize,UnsatisfiedJump *val)

{
  uint uVar1;
  uint uVar2;
  UnsatisfiedJump *ptr;
  bool bVar3;
  undefined3 uVar4;
  UnsatisfiedJump *pUVar5;
  uint oldMax;
  UnsatisfiedJump *oldData;
  UnsatisfiedJump *val_local;
  uint newSize_local;
  FastVector<UnsatisfiedJump,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  uVar2 = this->count;
  this->count = uVar2 + 1;
  pUVar5 = this->data + uVar2;
  bVar3 = val->isNear;
  uVar4 = *(undefined3 *)&val->field_0x5;
  pUVar5->labelID = val->labelID;
  pUVar5->isNear = bVar3;
  *(undefined3 *)&pUVar5->field_0x5 = uVar4;
  pUVar5->jmpPos = val->jmpPos;
  if (ptr != (UnsatisfiedJump *)0x0) {
    NULLC::destruct<UnsatisfiedJump>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}